

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

void __thiscall kj::_::BTreeImpl::clear(BTreeImpl *this)

{
  if (this->tree != (NodeUnion *)EMPTY_NODE) {
    memset(this->tree,0,(ulong)this->treeCapacity << 6);
    this->height = 0;
    this->freelistHead = 1;
    this->freelistSize = this->treeCapacity - 1;
    this->beginLeaf = 0;
    this->endLeaf = 0;
  }
  return;
}

Assistant:

void BTreeImpl::clear() {
  if (tree != &EMPTY_NODE) {
    azero(tree, treeCapacity);
    height = 0;
    freelistHead = 1;
    freelistSize = treeCapacity - 1;  // subtract one to account for the root node
    beginLeaf = 0;
    endLeaf = 0;
  }
}